

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

_Bool multi_handle_timeout
                (Curl_easy *data,curltime *now,_Bool *stream_error,CURLcode *result,
                _Bool connect_timeout)

{
  long lVar1;
  curl_off_t cVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  timediff_t tVar15;
  timediff_t tVar16;
  char *fmt;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  
  tVar15 = Curl_timeleft(data,now,connect_timeout);
  if (-1 < tVar15) goto LAB_004ead20;
  if (data->mstate == MSTATE_CONNECTING) {
    uVar9 = now->tv_sec;
    uVar10 = now->tv_usec;
    newer_00.tv_usec = uVar10;
    newer_00.tv_sec = uVar9;
    uVar7 = (data->progress).t_startsingle.tv_sec;
    uVar8 = (data->progress).t_startsingle.tv_usec;
    older_00.tv_usec = uVar8;
    older_00.tv_sec = uVar7;
    older_00._12_4_ = 0;
    newer_00._12_4_ = 0;
    tVar16 = Curl_timediff(newer_00,older_00);
    fmt = "Connection timed out after %ld milliseconds";
LAB_004eac7e:
    Curl_failf(data,fmt,tVar16);
  }
  else {
    if (data->mstate == MSTATE_RESOLVING) {
      uVar5 = now->tv_sec;
      uVar6 = now->tv_usec;
      newer.tv_usec = uVar6;
      newer.tv_sec = uVar5;
      uVar3 = (data->progress).t_startsingle.tv_sec;
      uVar4 = (data->progress).t_startsingle.tv_usec;
      older.tv_usec = uVar4;
      older.tv_sec = uVar3;
      older._12_4_ = 0;
      newer._12_4_ = 0;
      tVar16 = Curl_timediff(newer,older);
      fmt = "Resolving timed out after %ld milliseconds";
      goto LAB_004eac7e;
    }
    lVar1 = (data->req).size;
    uVar13 = now->tv_sec;
    uVar14 = now->tv_usec;
    newer_01.tv_usec = uVar14;
    newer_01.tv_sec = uVar13;
    uVar11 = (data->progress).t_startsingle.tv_sec;
    uVar12 = (data->progress).t_startsingle.tv_usec;
    older_01.tv_usec = uVar12;
    older_01.tv_sec = uVar11;
    older_01._12_4_ = 0;
    newer_01._12_4_ = 0;
    tVar16 = Curl_timediff(newer_01,older_01);
    cVar2 = (data->req).bytecount;
    if (lVar1 == -1) {
      Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar16,
                 cVar2);
    }
    else {
      Curl_failf(data,
                 "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                 tVar16,cVar2,(data->req).size);
    }
  }
  if (MSTATE_DO < data->mstate) {
    Curl_conncontrol(data->conn,2);
    *stream_error = true;
  }
  *result = CURLE_OPERATION_TIMEDOUT;
  multi_done(data,CURLE_OPERATION_TIMEDOUT,true);
LAB_004ead20:
  return SUB81((ulong)tVar15 >> 0x3f,0);
}

Assistant:

static bool multi_handle_timeout(struct Curl_easy *data,
                                 struct curltime *now,
                                 bool *stream_error,
                                 CURLcode *result,
                                 bool connect_timeout)
{
  timediff_t timeout_ms;
  timeout_ms = Curl_timeleft(data, now, connect_timeout);

  if(timeout_ms < 0) {
    /* Handle timed out */
    if(data->mstate == MSTATE_RESOLVING)
      failf(data, "Resolving timed out after %" CURL_FORMAT_TIMEDIFF_T
            " milliseconds",
            Curl_timediff(*now, data->progress.t_startsingle));
    else if(data->mstate == MSTATE_CONNECTING)
      failf(data, "Connection timed out after %" CURL_FORMAT_TIMEDIFF_T
            " milliseconds",
            Curl_timediff(*now, data->progress.t_startsingle));
    else {
      struct SingleRequest *k = &data->req;
      if(k->size != -1) {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(*now, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T
              " bytes received",
              Curl_timediff(*now, data->progress.t_startsingle),
              k->bytecount);
      }
    }

    /* Force connection closed if the connection has indeed been used */
    if(data->mstate > MSTATE_DO) {
      streamclose(data->conn, "Disconnected with pending data");
      *stream_error = TRUE;
    }
    *result = CURLE_OPERATION_TIMEDOUT;
    (void)multi_done(data, *result, TRUE);
  }

  return (timeout_ms < 0);
}